

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O2

SampledSpectrum __thiscall
pbrt::AOIntegrator::Li
          (AOIntegrator *this,RayDifferential *ray,SampledWavelengths *lambda,SamplerHandle *sampler
          ,ScratchBuffer *scratchBuffer,VisibleSurface *visibleSurface)

{
  Normal3f *n;
  undefined1 auVar1 [16];
  bool bVar2;
  ShapeIntersection *this_00;
  ShapeIntersection *pSVar3;
  int iVar4;
  anon_class_8_1_5ef94505 samp;
  undefined1 auVar5 [16];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 in_ZMM1 [64];
  undefined1 auVar18 [60];
  undefined1 auVar16 [64];
  undefined1 auVar19 [56];
  undefined1 auVar17 [64];
  Vector3<float> VVar20;
  Normal3<float> NVar21;
  Vector3f VVar22;
  SampledSpectrum SVar23;
  Tuple3<pbrt::Vector3,_float> local_370;
  float local_364;
  Tuple3<pbrt::Normal3,_float> local_360;
  SamplerHandle *local_350;
  Point2f u;
  SampledSpectrum local_340;
  TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
  *local_330;
  Tuple3<pbrt::Vector3,_float> *local_328;
  ScratchBuffer *local_320;
  Tuple3<pbrt::Vector3,_float> local_318;
  uintptr_t local_308;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_300;
  anon_struct_8_0_00000001_for___align local_2f8;
  float fStack_2f0;
  float local_2ec;
  MediumHandle local_2d8;
  SampledSpectrum local_2c8;
  SampledSpectrum L;
  BSDF bsdf;
  aligned_storage_t<sizeof(pbrt::ShapeIntersection),_alignof(pbrt::ShapeIntersection)> local_268;
  Frame f;
  optional<pbrt::ShapeIntersection> si;
  undefined1 auVar15 [56];
  undefined1 extraout_var [56];
  
  local_350 = sampler;
  local_320 = scratchBuffer;
  SampledSpectrum::SampledSpectrum(&L,0.0);
  local_328 = &(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>;
  local_330 = (TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
               *)&this->illuminant;
  si.set = false;
  do {
    auVar15 = (undefined1  [56])0x0;
    Integrator::Intersect
              ((optional<pbrt::ShapeIntersection> *)&local_268.__align,(Integrator *)this,
               &ray->super_Ray,INFINITY);
    pstd::optional<pbrt::ShapeIntersection>::operator=
              (&si,(optional<pbrt::ShapeIntersection> *)&local_268.__align);
    pstd::optional<pbrt::ShapeIntersection>::~optional
              ((optional<pbrt::ShapeIntersection> *)&local_268.__align);
    if (si.set != true) goto LAB_003f58b3;
    this_00 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
    local_300.bits =
         (this->super_RayIntegrator).super_ImageTileIntegrator.camera.
         super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
         .bits;
    local_308 = (local_350->
                super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
                ).bits;
    SurfaceInteraction::GetBSDF
              (&bsdf,&this_00->intr,ray,lambda,(CameraHandle *)&local_300,local_320,
               (SamplerHandle)&local_308);
    auVar18 = in_ZMM1._4_60_;
    if (((ulong)bsdf.bxdf.
                super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
                .bits & 0xffffffffffff) == 0) {
      pSVar3 = pstd::optional<pbrt::ShapeIntersection>::value(&si);
      SurfaceInteraction::SkipIntersection(&this_00->intr,ray,pSVar3->tHit);
      iVar4 = 2;
    }
    else {
      VVar20 = Tuple3<pbrt::Vector3,_float>::operator-(local_328);
      local_268._8_4_ = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar15;
      n = &(this_00->intr).super_Interaction.n;
      local_268.__align = (anon_struct_8_0_00000001_for___align)vmovlps_avx(auVar6._0_16_);
      NVar21 = FaceForward<float>(n,(Vector3<float> *)&local_268.__align);
      local_360.z = NVar21.super_Tuple3<pbrt::Normal3,_float>.z;
      auVar7._0_8_ = NVar21.super_Tuple3<pbrt::Normal3,_float>._0_8_;
      auVar7._8_56_ = auVar15;
      local_360._0_8_ = vmovlps_avx(auVar7._0_16_);
      VVar20 = Normalize<float>(&(this_00->intr).dpdu);
      local_318.z = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar15;
      local_318._0_8_ = vmovlps_avx(auVar8._0_16_);
      VVar20 = Cross<float>(n,(Vector3<float> *)&local_318);
      auVar16._0_4_ = VVar20.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar16._4_60_ = auVar18;
      local_370.x = 0.0;
      local_370.y = 0.0;
      local_370.z = 0.0;
      auVar9._0_8_ = TaggedPointer<pbrt::HaltonSampler,pbrt::PaddedSobolSampler,pbrt::PMJ02BNSampler,pbrt::RandomSampler,pbrt::SobolSampler,pbrt::StratifiedSampler,pbrt::MLTSampler,pbrt::DebugMLTSampler>
                     ::Dispatch<pbrt::SamplerHandle::Get2D()::_lambda(auto:1)_1_>
                               (VVar20.super_Tuple3<pbrt::Vector3,_float>._0_8_,auVar16._0_8_,
                                local_350);
      auVar18 = auVar16._4_60_;
      auVar9._8_56_ = extraout_var;
      u.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)vmovlps_avx(auVar9._0_16_);
      if (this->cosSample == true) {
        auVar15 = extraout_var;
        VVar22 = SampleCosineHemisphere(&u);
        in_ZMM1._0_4_ = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
        in_ZMM1._4_60_ = auVar18;
        auVar10._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar10._8_56_ = auVar15;
        local_370._0_8_ = vmovlps_avx(auVar10._0_16_);
        auVar5._8_4_ = 0x7fffffff;
        auVar5._0_8_ = 0x7fffffff7fffffff;
        auVar5._12_4_ = 0x7fffffff;
        auVar5 = vandps_avx512vl(in_ZMM1._0_16_,auVar5);
        local_364 = auVar5._0_4_ * 0.31830987;
        auVar15 = (undefined1  [56])0x0;
        local_370.z = in_ZMM1._0_4_;
        if ((local_364 == 0.0) && (!NAN(local_364))) {
          SampledSpectrum::SampledSpectrum(&local_340,0.0);
          iVar4 = 1;
          goto LAB_003f58a6;
        }
      }
      else {
        auVar15 = extraout_var;
        VVar22 = SampleUniformHemisphere(&u);
        local_370.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
        auVar11._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
        auVar11._8_56_ = auVar15;
        local_370._0_8_ = vmovlps_avx(auVar11._0_16_);
        local_364 = 0.15915494;
      }
      Frame::FromZ(&f,(Normal3f *)&local_360);
      VVar22 = Frame::FromLocal(&f,(Vector3f *)&local_370);
      local_370.z = VVar22.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar12._0_8_ = VVar22.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar12._8_56_ = auVar15;
      local_370._0_8_ = vmovlps_avx(auVar12._0_16_);
      Interaction::SpawnRay
                ((RayDifferential *)&local_268.__align,(Interaction *)this_00,(Vector3f *)&local_370
                );
      in_ZMM1 = ZEXT1664(CONCAT124(local_268._16_12_,local_268._12_4_));
      local_2f8 = local_268.__align;
      fStack_2f0 = (float)local_268._8_4_;
      local_2ec = (float)local_268._12_4_;
      local_2d8.
      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
      .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                 )local_268._32_8_;
      auVar15 = (undefined1  [56])0x0;
      bVar2 = Integrator::IntersectP((Integrator *)this,(Ray *)&local_2f8,this->maxDist);
      auVar19 = in_ZMM1._8_56_;
      iVar4 = 0;
      if (!bVar2) {
        SVar23 = TaggedPointer<pbrt::ConstantSpectrum,pbrt::DenselySampledSpectrum,pbrt::PiecewiseLinearSpectrum,pbrt::RGBSpectrum,pbrt::RGBReflectanceSpectrum,pbrt::BlackbodySpectrum>
                 ::
                 Dispatch<pbrt::SpectrumHandle::Sample(pbrt::SampledWavelengths_const&)const::_lambda(auto:1)_1_>
                           (local_330,(anon_class_8_1_5ef94505)lambda);
        auVar17._0_8_ = SVar23.values.values._8_8_;
        auVar17._8_56_ = auVar19;
        auVar13._0_8_ = SVar23.values.values._0_8_;
        auVar13._8_56_ = auVar15;
        auVar5 = vmovlhps_avx(auVar13._0_16_,auVar17._0_16_);
        local_268.__align = auVar5._0_8_;
        local_268._8_4_ = auVar5._8_4_;
        local_268._12_4_ = auVar5._12_4_;
        auVar5 = vfmadd132ss_fma(ZEXT416((uint)local_360.y),
                                 ZEXT416((uint)(local_360.z * local_370.z)),
                                 ZEXT416((uint)local_370.y));
        auVar1 = vfmsub213ss_fma(ZEXT416((uint)local_370.z),ZEXT416((uint)local_360.z),
                                 ZEXT416((uint)(local_360.z * local_370.z)));
        auVar5 = vfmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ + auVar1._0_4_)),
                                 ZEXT416((uint)local_360.x),ZEXT416((uint)local_370.x));
        auVar19 = ZEXT856(auVar5._8_8_);
        auVar15 = ZEXT856(auVar5._8_8_);
        SampledSpectrum::SampledSpectrum(&local_2c8,auVar5._0_4_ / (local_364 * 3.1415927));
        SVar23 = SampledSpectrum::operator*((SampledSpectrum *)&local_268.__align,&local_2c8);
        in_ZMM1._0_8_ = SVar23.values.values._8_8_;
        in_ZMM1._8_56_ = auVar19;
        auVar14._0_8_ = SVar23.values.values._0_8_;
        auVar14._8_56_ = auVar15;
        local_340.values.values = (array<float,_4>)vmovlhps_avx(auVar14._0_16_,in_ZMM1._0_16_);
        iVar4 = 1;
      }
    }
LAB_003f58a6:
  } while (iVar4 == 2);
  if (iVar4 == 0) {
LAB_003f58b3:
    SampledSpectrum::SampledSpectrum(&local_340,0.0);
  }
  pstd::optional<pbrt::ShapeIntersection>::~optional(&si);
  return (array<float,_4>)(array<float,_4>)local_340;
}

Assistant:

SampledSpectrum AOIntegrator::Li(RayDifferential ray, SampledWavelengths &lambda,
                                 SamplerHandle sampler, ScratchBuffer &scratchBuffer,
                                 VisibleSurface *visibleSurface) const {
    SampledSpectrum L(0.f);

    // Intersect _ray_ with scene and store intersection in _isect_
    pstd::optional<ShapeIntersection> si;
retry:
    si = Intersect(ray);
    if (si) {
        SurfaceInteraction &isect = si->intr;
        BSDF bsdf = isect.GetBSDF(ray, lambda, camera, scratchBuffer, sampler);
        if (!bsdf) {
            isect.SkipIntersection(&ray, si->tHit);
            goto retry;
        }

        // Compute coordinate frame based on true geometry, not shading
        // geometry.
        Normal3f n = FaceForward(isect.n, -ray.d);
        Vector3f s = Normalize(isect.dpdu);
        Vector3f t = Cross(isect.n, s);

        Vector3f wi;
        Float pdf;
        Point2f u = sampler.Get2D();
        if (cosSample) {
            wi = SampleCosineHemisphere(u);
            pdf = CosineHemispherePDF(std::abs(wi.z));
        } else {
            wi = SampleUniformHemisphere(u);
            pdf = UniformHemispherePDF();
        }
        if (pdf == 0)
            return SampledSpectrum(0.);

        Frame f = Frame::FromZ(n);
        wi = f.FromLocal(wi);

        // Divide by pi so that fully visible is one.
        Ray r = isect.SpawnRay(wi);
        if (!IntersectP(r, maxDist))
            return illuminant.Sample(lambda) * SampledSpectrum(Dot(wi, n) / (Pi * pdf));
    }
    return SampledSpectrum(0.);
}